

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O2

bool __thiscall GraphViewer::setVertexColor(GraphViewer *this,int k,string *color)

{
  Connection *this_00;
  bool bVar1;
  string str;
  char buff [200];
  allocator local_129;
  string local_128;
  string local_108 [32];
  char local_e8 [208];
  
  sprintf(local_e8,"setVertexColor %d %s\n",k,(color->_M_dataplus)._M_p);
  std::__cxx11::string::string(local_108,local_e8,&local_129);
  this_00 = this->con;
  std::__cxx11::string::string((string *)&local_128,local_108);
  bVar1 = Connection::sendMsg(this_00,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string(local_108);
  return bVar1;
}

Assistant:

bool GraphViewer::setVertexColor(int k, string color) {
	char buff[200];
	sprintf(buff, "setVertexColor %d %s\n", k, color.c_str());
	string str(buff);
	return con->sendMsg(str);
}